

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall
OpenMD::NameFinder::matchStuntDouble
          (NameFinder *this,string *molName,string *sdName,SelectionSet *bs)

{
  bool bVar1;
  iterator this_00;
  iterator node;
  SelectionSet *in_RDI;
  iterator j;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  sdNodes;
  iterator i;
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  molNodes;
  SelectionSet *in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff50;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_a0;
  SelectionSet local_98;
  string *in_stack_ffffffffffffff88;
  TreeNodePtr *in_stack_ffffffffffffff90;
  NameFinder *in_stack_ffffffffffffff98;
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  local_60 [12];
  
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr
            ((shared_ptr<OpenMD::TreeNode> *)in_RDI,
             (shared_ptr<OpenMD::TreeNode> *)in_stack_ffffffffffffff38);
  getMatchedChildren(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3c91e8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
  ::__normal_iterator(local_60);
  this_00 = std::
            vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
            ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                     *)in_stack_ffffffffffffff38);
  local_60[0]._M_current = (shared_ptr<OpenMD::TreeNode> *)this_00;
  while( true ) {
    node = std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_ffffffffffffff38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator*(local_60);
    in_stack_ffffffffffffff38 = &local_98;
    std::shared_ptr<OpenMD::TreeNode>::shared_ptr
              ((shared_ptr<OpenMD::TreeNode> *)in_RDI,
               (shared_ptr<OpenMD::TreeNode> *)in_stack_ffffffffffffff38);
    getMatchedChildren((NameFinder *)this_00._M_current,node._M_current,in_stack_ffffffffffffff88);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3c927a);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::__normal_iterator(&local_a0);
    local_a0._M_current =
         (shared_ptr<OpenMD::TreeNode> *)
         std::
         vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
         ::begin((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_ffffffffffffff38);
    while( true ) {
      in_stack_ffffffffffffff50 =
           std::
           vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           ::end((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)in_stack_ffffffffffffff38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_RDI,
                         (__normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator*(&local_a0);
      std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3c92d6);
      SelectionSet::operator|=(in_RDI,in_stack_ffffffffffffff38);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
      ::operator++(&local_a0);
    }
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    ~vector((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
             *)in_stack_ffffffffffffff50._M_current);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<OpenMD::TreeNode>_*,_std::vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>_>
    ::operator++(local_60);
  }
  std::
  vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
  ~vector((vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           *)in_stack_ffffffffffffff50._M_current);
  return;
}

Assistant:

void NameFinder::matchStuntDouble(const std::string& molName,
                                    const std::string& sdName,
                                    SelectionSet& bs) {
    std::vector<TreeNodePtr> molNodes = getMatchedChildren(root_, molName);
    std::vector<TreeNodePtr>::iterator i;
    for (i = molNodes.begin(); i != molNodes.end(); ++i) {
      std::vector<TreeNodePtr> sdNodes = getMatchedChildren(*i, sdName);
      std::vector<TreeNodePtr>::iterator j;
      for (j = sdNodes.begin(); j != sdNodes.end(); ++j) {
        bs |= (*j)->bs;
      }
    }
  }